

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

bool __thiscall Am_Value::operator!=(Am_Value *this,bool test_value)

{
  ushort uVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  
  uVar1 = this->type;
  if ((uVar1 & 0x7000) != 0) {
switchD_0022bb6d_caseD_2:
    bVar4 = (this->value).wrapper_value == (Am_Wrapper *)0x0;
    goto LAB_0022bb4e;
  }
  bVar2 = 1;
  switch(uVar1) {
  case 2:
  case 3:
  case 9:
  case 10:
    goto switchD_0022bb6d_caseD_2;
  case 4:
    return (this->value).bool_value != test_value;
  case 5:
    bVar4 = NAN((this->value).float_value);
    bVar5 = (this->value).float_value == 0.0;
LAB_0022bbb5:
    bVar4 = (bool)(!bVar5 | bVar4);
    goto LAB_0022bb51;
  case 6:
  case 8:
    goto switchD_0022bb6d_caseD_6;
  case 7:
    bVar4 = (this->value).bool_value == false;
    break;
  default:
    if (uVar1 == 0x8006) {
      dVar6 = Am_Double_Data::operator_cast_to_double((Am_Double_Data *)(this->value).wrapper_value)
      ;
      bVar4 = NAN(dVar6);
      bVar5 = dVar6 == 0.0;
      goto LAB_0022bbb5;
    }
    if (uVar1 != 0x8008) {
      return true;
    }
    pcVar3 = Am_String_Data::operator_cast_to_char_((Am_String_Data *)(this->value).wrapper_value);
    bVar4 = pcVar3 == (char *)0x0;
  }
LAB_0022bb4e:
  bVar4 = !bVar4;
LAB_0022bb51:
  bVar2 = bVar4 ^ test_value;
switchD_0022bb6d_caseD_6:
  return (bool)bVar2;
}

Assistant:

bool
Am_Value::operator!=(bool test_value) const
{
  if (Am_Type_Class(type) != Am_NONE)
    return !!value.voidptr_value != test_value;
  switch (type) {
  case Am_INT:
  case Am_LONG:
    return !!value.long_value != test_value;
  case Am_BOOL:
    return value.bool_value != test_value;
  case Am_FLOAT:
    return !!value.float_value != test_value;
  case Am_DOUBLE:
    return !!(double)*(Am_Double_Data *)value.wrapper_value != test_value;
  case Am_CHAR:
    return !!value.char_value != test_value;
  case Am_STRING:
    return !!(const char *)*(Am_String_Data *)value.wrapper_value != test_value;
  case Am_VOIDPTR:
    return !!value.voidptr_value != test_value;
  case Am_PROC:
    return !!value.proc_value != test_value;
  default:
    return true;
  }
}